

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-objdump.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_14::BinaryReaderObjdumpPrepass::OnDataSymbol
          (BinaryReaderObjdumpPrepass *this,Index index,uint32_t flags,string_view name,
          Index segment,uint32_t offset,uint32_t size)

{
  reference this_00;
  undefined1 local_68 [40];
  Index local_40;
  Index local_34;
  uint32_t local_30;
  Index segment_local;
  uint32_t flags_local;
  Index index_local;
  BinaryReaderObjdumpPrepass *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderObjdumpPrepass *)name.data_;
  local_68._0_4_ = Data;
  local_34 = segment;
  local_30 = flags;
  segment_local = index;
  _flags_local = this;
  string_view::to_string_abi_cxx11_((string_view *)(local_68 + 8));
  local_40 = 0;
  this_00 = std::vector<wabt::ObjdumpSymbol,_std::allocator<wabt::ObjdumpSymbol>_>::operator[]
                      (&((this->super_BinaryReaderObjdumpBase).objdump_state_)->symtab,
                       (ulong)segment_local);
  ObjdumpSymbol::operator=(this_00,(ObjdumpSymbol *)local_68);
  ObjdumpSymbol::~ObjdumpSymbol((ObjdumpSymbol *)local_68);
  Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result OnDataSymbol(Index index,
                      uint32_t flags,
                      string_view name,
                      Index segment,
                      uint32_t offset,
                      uint32_t size) override {
    objdump_state_->symtab[index] = {SymbolType::Data, name.to_string(), 0};
    return Result::Ok;
  }